

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option_inl.hpp
# Opt level: O0

Validator * __thiscall CLI::Option::get_validator(Option *this,string *Validator_name)

{
  bool bVar1;
  __type _Var2;
  string *__rhs;
  ulong uVar3;
  reference pvVar4;
  OptionNotFound *this_00;
  allocator local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  reference local_40;
  Validator *Validator;
  iterator __end1;
  iterator __begin1;
  vector<CLI::Validator,_std::allocator<CLI::Validator>_> *__range1;
  string *Validator_name_local;
  Option *this_local;
  
  __end1 = std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::begin(&this->validators_);
  Validator = (Validator *)
              std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::end(&this->validators_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
                                     *)&Validator), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
               ::operator*(&__end1);
    __rhs = CLI::Validator::get_name_abi_cxx11_(local_40);
    _Var2 = ::std::operator==(Validator_name,__rhs);
    if (_Var2) {
      return local_40;
    }
    __gnu_cxx::
    __normal_iterator<CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
    ::operator++(&__end1);
  }
  uVar3 = ::std::__cxx11::string::empty();
  if (((uVar3 & 1) != 0) &&
     (bVar1 = std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::empty
                        (&this->validators_), !bVar1)) {
    pvVar4 = std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::front(&this->validators_)
    ;
    return pvVar4;
  }
  this_00 = (OptionNotFound *)__cxa_allocate_exception(0x38);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_a0,"Validator ",&local_a1);
  ::std::operator+(&local_80,&local_a0,Validator_name);
  ::std::operator+(&local_60,&local_80," Not Found");
  OptionNotFound::OptionNotFound(this_00,&local_60);
  __cxa_throw(this_00,&OptionNotFound::typeinfo,OptionNotFound::~OptionNotFound);
}

Assistant:

CLI11_INLINE Validator *Option::get_validator(const std::string &Validator_name) {
    for(auto &Validator : validators_) {
        if(Validator_name == Validator.get_name()) {
            return &Validator;
        }
    }
    if((Validator_name.empty()) && (!validators_.empty())) {
        return &(validators_.front());
    }
    throw OptionNotFound(std::string{"Validator "} + Validator_name + " Not Found");
}